

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::IsDivisibleBy
          (MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  ulong uVar1;
  _List_node_base *p_Var2;
  ulong uVar3;
  
  p_Var2 = (_List_node_base *)this;
  do {
    p_Var2 = (((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)&p_Var2->_M_next)->
             super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if ((p_Var2 == (_List_node_base *)this) ||
       (((mRight->super_WW<135UL>)._words[0] & ~*(ulong *)(p_Var2 + 1)) != 0)) break;
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 2) break;
      uVar1 = uVar3 + 1;
    } while (((mRight->super_WW<135UL>)._words[uVar3 + 1] &
             ~*(ulong *)((long)(p_Var2 + 1) + 8U + uVar3 * 8)) == 0);
  } while (1 < uVar3);
  return p_Var2 == (_List_node_base *)this;
}

Assistant:

bool IsDivisibleBy(const MM<_n>& mRight) const
	{
		for (const_iterator iter = begin(); iter != end(); ++iter)
			if (!iter->IsDivisibleBy(mRight))
				return false;
		return true;
	}